

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O1

int Gia_ManMultiProve(Gia_Man_t *p,Bmc_MulPar_t *pPars)

{
  uint uVar1;
  Aig_Man_t *p_00;
  Vec_Ptr_t *pVVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  
  pVVar2 = p->vSeqModelVec;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar2->nSize) {
      lVar5 = 0;
      do {
        if ((void *)0x2 < pVVar2->pArray[lVar5]) {
          free(pVVar2->pArray[lVar5]);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < pVVar2->nSize);
    }
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (void **)0x0;
    }
    free(pVVar2);
    p->vSeqModelVec = (Vec_Ptr_t *)0x0;
  }
  uVar4 = 0;
  p_00 = Gia_ManToAig(p,0);
  pVVar2 = Gia_ManMultiProveAig(p_00,pPars);
  p->vSeqModelVec = pVVar2;
  uVar1 = pVVar2->nSize;
  if (uVar1 == p->vCos->nSize - p->nRegs) {
    if (0 < (int)uVar1) {
      uVar3 = 0;
      uVar4 = 0;
      do {
        uVar4 = uVar4 + (pVVar2->pArray[uVar3] == (void *)0x0);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    return -(uint)(uVar4 == uVar1);
  }
  __assert_fail("Vec_PtrSize(p->vSeqModelVec) == Gia_ManPoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMulti.c"
                ,0x11e,"int Gia_ManMultiProve(Gia_Man_t *, Bmc_MulPar_t *)");
}

Assistant:

int Gia_ManMultiProve( Gia_Man_t * p, Bmc_MulPar_t * pPars )
{
    Aig_Man_t * pAig;
    if ( p->vSeqModelVec )
        Vec_PtrFreeFree( p->vSeqModelVec ), p->vSeqModelVec = NULL;
    pAig = Gia_ManToAig( p, 0 );
    p->vSeqModelVec = Gia_ManMultiProveAig( pAig, pPars ); // deletes pAig
    assert( Vec_PtrSize(p->vSeqModelVec) == Gia_ManPoNum(p) );
    return Vec_PtrCountZero(p->vSeqModelVec) == Vec_PtrSize(p->vSeqModelVec) ? -1 : 0;
}